

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopup(char *str_id,ImGuiWindowFlags flags)

{
  ImGuiID id_00;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiWindowFlags flags_local;
  char *str_id_local;
  
  if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    id_00 = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
    str_id_local._7_1_ = BeginPopupEx(id_00,flags | 0x141);
  }
  else {
    ImGuiNextWindowData::ClearFlags(&GImGui->NextWindowData);
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::BeginPopup(const char* str_id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size <= g.BeginPopupStack.Size) // Early out for performance
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }
    flags |= ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings;
    ImGuiID id = g.CurrentWindow->GetID(str_id);
    return BeginPopupEx(id, flags);
}